

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

void ly_in_free(ly_in *in,ly_bool destroy)

{
  ly_bool destroy_local;
  ly_in *in_local;
  
  if (in != (ly_in *)0x0) {
    if (in->type == LY_IN_ERROR) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/in.c",0x10c);
    }
    else {
      if (destroy == '\0') {
        if ((in->type != LY_IN_MEMORY) &&
           (ly_munmap(in->start,in->length), in->type == LY_IN_FILEPATH)) {
          close((in->method).fd);
          free((in->method).fpath.filepath);
        }
      }
      else if (in->type == LY_IN_MEMORY) {
        free(in->start);
      }
      else {
        ly_munmap(in->start,in->length);
        if (in->type == LY_IN_FILE) {
          fclose((FILE *)(in->method).f);
        }
        else {
          close((in->method).fd);
          if (in->type == LY_IN_FILEPATH) {
            free((in->method).fpath.filepath);
          }
        }
      }
      free(in);
    }
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_in_free(struct ly_in *in, ly_bool destroy)
{
    if (!in) {
        return;
    } else if (in->type == LY_IN_ERROR) {
        LOGINT(NULL);
        return;
    }

    if (destroy) {
        if (in->type == LY_IN_MEMORY) {
            free((char *)in->start);
        } else {
            ly_munmap((char *)in->start, in->length);

            if (in->type == LY_IN_FILE) {
                fclose(in->method.f);
            } else {
                close(in->method.fd);

                if (in->type == LY_IN_FILEPATH) {
                    free(in->method.fpath.filepath);
                }
            }
        }
    } else if (in->type != LY_IN_MEMORY) {
        ly_munmap((char *)in->start, in->length);

        if (in->type == LY_IN_FILEPATH) {
            close(in->method.fpath.fd);
            free(in->method.fpath.filepath);
        }
    }

    free(in);
}